

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midl.c
# Opt level: O1

int mdb_midl_need(MDB_IDL *idp,uint num)

{
  MDB_IDL pMVar1;
  ulong *puVar2;
  int iVar3;
  uint uVar4;
  
  pMVar1 = *idp;
  uVar4 = num + (int)*pMVar1;
  iVar3 = 0;
  if (pMVar1[-1] < (ulong)uVar4) {
    uVar4 = uVar4 + (uVar4 >> 2) + 0x102 & 0xffffff00;
    puVar2 = (ulong *)realloc(pMVar1 + -1,(ulong)uVar4 * 8);
    if (puVar2 == (ulong *)0x0) {
      iVar3 = 0xc;
    }
    else {
      *puVar2 = (ulong)(uVar4 - 2);
      *idp = puVar2 + 1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mdb_midl_need( MDB_IDL *idp, unsigned num )
{
	MDB_IDL ids = *idp;
	num += ids[0];
	if (num > ids[-1]) {
		num = (num + num/4 + (256 + 2)) & -256;
		if (!(ids = realloc(ids-1, num * sizeof(MDB_ID))))
			return ENOMEM;
		*ids++ = num - 2;
		*idp = ids;
	}
	return 0;
}